

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_threadprivate.cpp
# Opt level: O0

void kmp_threadprivate_insert_private_data(int gtid,void *pc_addr,void *data_addr,size_t pc_size)

{
  shared_common *psVar1;
  kmp_lock_t *lck;
  kmp_ticket_lock *pkVar2;
  void *in_RCX;
  void *in_RSI;
  int in_EDI;
  shared_common *d_tn;
  shared_common **lnk_tn;
  kmp_int32 in_stack_ffffffffffffffcc;
  size_t in_stack_ffffffffffffffd8;
  
  psVar1 = __kmp_find_shared_task_common(&__kmp_threadprivate_d_table,in_EDI,in_RSI);
  if (psVar1 == (shared_common *)0x0) {
    lck = (kmp_lock_t *)___kmp_allocate(0);
    *(void **)&(lck->lk).next_ticket = in_RSI;
    pkVar2 = (kmp_ticket_lock *)__kmp_init_common_data(in_RCX,in_stack_ffffffffffffffd8);
    (lck->lk).self = pkVar2;
    *(void **)((long)lck + 0x48) = in_RCX;
    __kmp_acquire_lock(lck,in_stack_ffffffffffffffcc);
    (lck->pool).next = (kmp_user_lock *)__kmp_threadprivate_d_table.data[(ulong)in_RSI >> 3 & 0x1ff]
    ;
    __kmp_threadprivate_d_table.data[(ulong)in_RSI >> 3 & 0x1ff] = (shared_common *)lck;
    __kmp_release_lock(lck,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void kmp_threadprivate_insert_private_data(int gtid, void *pc_addr,
                                           void *data_addr, size_t pc_size) {
  struct shared_common **lnk_tn, *d_tn;
  KMP_DEBUG_ASSERT(__kmp_threads[gtid] &&
                   __kmp_threads[gtid]->th.th_root->r.r_active == 0);

  d_tn = __kmp_find_shared_task_common(&__kmp_threadprivate_d_table, gtid,
                                       pc_addr);

  if (d_tn == 0) {
    d_tn = (struct shared_common *)__kmp_allocate(sizeof(struct shared_common));

    d_tn->gbl_addr = pc_addr;
    d_tn->pod_init = __kmp_init_common_data(data_addr, pc_size);
    /*
            d_tn->obj_init = 0;  // AC: commented out because __kmp_allocate
       zeroes the memory
            d_tn->ct.ctor = 0;
            d_tn->cct.cctor = 0;;
            d_tn->dt.dtor = 0;
            d_tn->is_vec = FALSE;
            d_tn->vec_len = 0L;
    */
    d_tn->cmn_size = pc_size;

    __kmp_acquire_lock(&__kmp_global_lock, gtid);

    lnk_tn = &(__kmp_threadprivate_d_table.data[KMP_HASH(pc_addr)]);

    d_tn->next = *lnk_tn;
    *lnk_tn = d_tn;

    __kmp_release_lock(&__kmp_global_lock, gtid);
  }
}